

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int biseqcstrcaseless(const_bstring b,char *s)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  long lVar4;
  __int32_t **pp_Var5;
  uint uVar6;
  long lVar7;
  
  uVar6 = 0xffffffff;
  if (((s != (char *)0x0 && b != (const_bstring)0x0) && (puVar3 = b->data, puVar3 != (uchar *)0x0))
     && (lVar4 = (long)b->slen, -1 < lVar4)) {
    for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
      bVar1 = s[lVar7];
      if ((ulong)bVar1 == 0) {
        return 0;
      }
      bVar2 = puVar3[lVar7];
      if ((bVar2 != bVar1) &&
         (pp_Var5 = __ctype_tolower_loc(), (*pp_Var5)[bVar2] != (uint)*(byte *)(*pp_Var5 + bVar1)))
      {
        return 0;
      }
    }
    uVar6 = (uint)(s[lVar4] == '\0');
  }
  return uVar6;
}

Assistant:

int biseqcstrcaseless (const_bstring b, const char * s) {
int i;
	if (b == NULL || s == NULL || b->data == NULL || b->slen < 0)
		return BSTR_ERR;
	for (i=0; i < b->slen; i++) {
		if (s[i] == '\0' ||
		    (b->data[i] != (unsigned char) s[i] &&
		     downcase (b->data[i]) != (unsigned char) downcase (s[i])))
			return BSTR_OK;
	}
	return s[i] == '\0';
}